

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O0

QByteArray * QInternalMimeData::renderDataHelper(QString *mimeType,QMimeData *data)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  QByteArray *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  ushort *colBuf;
  QByteArray *ba;
  QStringView type;
  QBuffer buf_1;
  QImage image_1;
  QLatin1StringView prefix;
  QBuffer buf;
  QImage image;
  QColor c;
  QColor *in_stack_fffffffffffffe08;
  QByteArray *this;
  OpenModeFlag flags;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  byte bVar5;
  QString *in_stack_fffffffffffffe18;
  QVariant *this_00;
  int iVar6;
  QStringView *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  float fVar7;
  QImage *this_01;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  qsizetype local_110;
  char *local_108;
  QLatin1StringView local_100;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  QLatin1StringView local_c0;
  undefined1 local_b0 [24];
  QColor local_98;
  QLatin1StringView local_88;
  undefined6 local_78;
  undefined2 uStack_72;
  undefined6 uStack_70;
  undefined2 uStack_6a;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->super_QPaintDevice)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->super_QPaintDevice)->ptr = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x3a7f12);
  local_88 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe18,
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  bVar1 = ::operator==(in_stack_fffffffffffffe18,
                       (QLatin1StringView *)
                       CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  if (bVar1) {
    QByteArray::resize((longlong)this_01);
    pcVar2 = QByteArray::data((QByteArray *)
                              CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    local_78 = 0xaaaaaaaaaaaa;
    uStack_72 = 0xaaaa;
    uStack_70 = 0xaaaaaaaaaaaa;
    uStack_6a = 0xaaaa;
    this_00 = &local_28;
    QMimeData::colorData();
    local_98 = qvariant_cast<QColor>((QVariant *)in_stack_fffffffffffffe20);
    uStack_70 = local_98.ct._4_6_;
    local_78 = local_98._0_6_;
    uStack_72 = local_98.ct._2_2_;
    ::QVariant::~QVariant(this_00);
    fVar4 = QColor::redF((QColor *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    fVar7 = 65535.0;
    *(short *)pcVar2 = (short)(int)(fVar4 * 65535.0);
    fVar4 = QColor::greenF((QColor *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    *(short *)(pcVar2 + 2) = (short)(int)(fVar4 * fVar7);
    fVar4 = QColor::blueF((QColor *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    *(short *)(pcVar2 + 4) = (short)(int)(fVar4 * fVar7);
    fVar4 = QColor::alphaF(in_stack_fffffffffffffe08);
    *(short *)(pcVar2 + 6) = (short)(int)(fVar4 * fVar7);
  }
  else {
    QMimeData::data((QString *)local_b0);
    QByteArray::operator=
              ((QByteArray *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (QByteArray *)in_stack_fffffffffffffe08);
    QByteArray::~QByteArray((QByteArray *)0x3a80ba);
    bVar1 = QByteArray::isEmpty((QByteArray *)0x3a80c4);
    if (bVar1) {
      this = in_RSI;
      local_c0 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffe18,
                            CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      bVar1 = ::operator==(in_stack_fffffffffffffe18,
                           (QLatin1StringView *)
                           CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      bVar5 = 0;
      if (bVar1) {
        bVar5 = QMimeData::hasImage();
      }
      if ((bVar5 & 1) == 0) {
        local_100.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_100.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_100 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffe18,
                               CONCAT17(bVar5,in_stack_fffffffffffffe10));
        local_110 = local_100.m_size;
        local_108 = local_100.m_data;
        uVar3 = QString::startsWith((QLatin1String *)in_RSI,(CaseSensitivity)local_100.m_size);
        if (((uVar3 & 1) != 0) && (uVar3 = QMimeData::hasImage(), (uVar3 & 1) != 0)) {
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          local_120 = &DAT_aaaaaaaaaaaaaaaa;
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          QMimeData::imageData();
          qvariant_cast<QImage>
                    ((QVariant *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          ::QVariant::~QVariant(&local_68);
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          local_130 = &DAT_aaaaaaaaaaaaaaaa;
          QBuffer::QBuffer((QBuffer *)&local_138,(QByteArray *)this_01,(QObject *)0x0);
          QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT17(bVar5,in_stack_fffffffffffffe10),(OpenModeFlag)((ulong)this >> 0x20));
          QBuffer::open((QFlags_conflict *)&local_138);
          QStringView::QStringView<QString,_true>
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          QLatin1String::size(&local_100);
          QStringView::sliced(in_stack_fffffffffffffe20,(qsizetype)in_stack_fffffffffffffe18);
          iVar6 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
          QStringView::toLatin1((QStringView *)CONCAT17(bVar5,in_stack_fffffffffffffe10));
          QByteArray::toUpper(this);
          QByteArray::constData((QByteArray *)0x3a8410);
          QImage::save(this_01,(QIODevice *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       (char *)in_stack_fffffffffffffe20,iVar6);
          QByteArray::~QByteArray((QByteArray *)0x3a843a);
          QByteArray::~QByteArray((QByteArray *)0x3a8444);
          QBuffer::~QBuffer((QBuffer *)&local_138);
          QImage::~QImage((QImage *)CONCAT17(bVar5,in_stack_fffffffffffffe10));
        }
      }
      else {
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        QMimeData::imageData();
        iVar6 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
        flags = (OpenModeFlag)((ulong)this >> 0x20);
        qvariant_cast<QImage>
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        ::QVariant::~QVariant(&local_48);
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        QBuffer::QBuffer((QBuffer *)&local_e8,(QByteArray *)this_01,(QObject *)0x0);
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)CONCAT17(bVar5,in_stack_fffffffffffffe10),
                   flags);
        QBuffer::open((QFlags_conflict *)&local_e8);
        QImage::save(this_01,(QIODevice *)
                             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (char *)in_stack_fffffffffffffe20,iVar6);
        QBuffer::~QBuffer((QBuffer *)&local_e8);
        QImage::~QImage((QImage *)CONCAT17(bVar5,in_stack_fffffffffffffe10));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QInternalMimeData::renderDataHelper(const QString &mimeType, const QMimeData *data)
{
    QByteArray ba;
    if (mimeType == "application/x-color"_L1) {
        /* QMimeData can only provide colors as QColor or the name
           of a color as a QByteArray or a QString. So we need to do
           the conversion to application/x-color here.
           The application/x-color format is :
           type: application/x-color
           format: 16
           data[0]: red
           data[1]: green
           data[2]: blue
           data[3]: opacity
        */
        ba.resize(8);
        ushort * colBuf = (ushort *)ba.data();
        QColor c = qvariant_cast<QColor>(data->colorData());
        colBuf[0] = ushort(c.redF() * 0xFFFF);
        colBuf[1] = ushort(c.greenF() * 0xFFFF);
        colBuf[2] = ushort(c.blueF() * 0xFFFF);
        colBuf[3] = ushort(c.alphaF() * 0xFFFF);
    } else {
        ba = data->data(mimeType);
        if (ba.isEmpty()) {
            if (mimeType == "application/x-qt-image"_L1 && data->hasImage()) {
                QImage image = qvariant_cast<QImage>(data->imageData());
                QBuffer buf(&ba);
                buf.open(QBuffer::WriteOnly);
                // would there not be PNG ??
                image.save(&buf, "PNG");
            } else if (auto prefix = "image/"_L1; mimeType.startsWith(prefix) && data->hasImage()) {
                QImage image = qvariant_cast<QImage>(data->imageData());
                QBuffer buf(&ba);
                buf.open(QBuffer::WriteOnly);
                auto type = QStringView{mimeType}.sliced(prefix.size());
                image.save(&buf, type.toLatin1().toUpper().constData());
            }
        }
    }
    return ba;
}